

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_mident_metrics(Omega_h *this,Mesh *mesh,Int ent_dim,Reals *v2m,bool has_degen)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  Read<double> local_98;
  Read<int> local_88 [2];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  LOs e2e;
  bool has_degen_local;
  Reals *v2m_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  e2e.write_.shared_alloc_.direct_ptr._7_1_ = has_degen;
  size_in = Mesh::nents(mesh,ent_dim);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  Read<int>::Read((Read<int> *)local_40,size_in,0,1,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  Read<int>::Read(local_88,(Read<int> *)local_40);
  Read<double>::Read(&local_98,v2m);
  get_mident_metrics(this,mesh,ent_dim,local_88,&local_98,
                     (bool)(e2e.write_.shared_alloc_.direct_ptr._7_1_ & 1));
  Read<double>::~Read(&local_98);
  Read<int>::~Read(local_88);
  Read<int>::~Read((Read<int> *)local_40);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics(Mesh* mesh, Int ent_dim, Reals v2m, bool has_degen) {
  LOs e2e(mesh->nents(ent_dim), 0, 1);
  return get_mident_metrics(mesh, ent_dim, e2e, v2m, has_degen);
}